

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5DlidxLvlNext(Fts5DlidxLvl *pLvl)

{
  byte bVar1;
  int iVar2;
  uchar *in_RDI;
  long in_FS_OFFSET;
  int iOff;
  Fts5Data *pData;
  u64 iVal;
  int local_24;
  u32 *v;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  v = *(u32 **)in_RDI;
  if (*(int *)(in_RDI + 8) == 0) {
    in_RDI[8] = '\x01';
    in_RDI[9] = '\0';
    in_RDI[10] = '\0';
    in_RDI[0xb] = '\0';
    iVar2 = sqlite3Fts5GetVarint32(in_RDI,v);
    *(int *)(in_RDI + 8) = iVar2 + *(int *)(in_RDI + 8);
    bVar1 = sqlite3Fts5GetVarint
                      ((uchar *)(*(long *)v + (long)*(int *)(in_RDI + 8)),(u64 *)(in_RDI + 0x18));
    *(uint *)(in_RDI + 8) = (uint)bVar1 + *(int *)(in_RDI + 8);
    *(undefined4 *)(in_RDI + 0x10) = *(undefined4 *)(in_RDI + 8);
  }
  else {
    for (local_24 = *(int *)(in_RDI + 8);
        (local_24 < (int)v[2] && (*(char *)(*(long *)v + (long)local_24) == '\0'));
        local_24 = local_24 + 1) {
    }
    if (local_24 < (int)v[2]) {
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      *(int *)(in_RDI + 0x14) = (local_24 - *(int *)(in_RDI + 8)) + 1 + *(int *)(in_RDI + 0x14);
      bVar1 = sqlite3Fts5GetVarint((uchar *)(*(long *)v + (long)local_24),(u64 *)&local_10);
      *(undefined1 **)(in_RDI + 0x18) = local_10 + *(long *)(in_RDI + 0x18);
      *(uint *)(in_RDI + 8) = (uint)bVar1 + local_24;
    }
    else {
      in_RDI[0xc] = '\x01';
      in_RDI[0xd] = '\0';
      in_RDI[0xe] = '\0';
      in_RDI[0xf] = '\0';
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return *(int *)(in_RDI + 0xc);
}

Assistant:

static int fts5DlidxLvlNext(Fts5DlidxLvl *pLvl){
  Fts5Data *pData = pLvl->pData;

  if( pLvl->iOff==0 ){
    assert( pLvl->bEof==0 );
    pLvl->iOff = 1;
    pLvl->iOff += fts5GetVarint32(&pData->p[1], pLvl->iLeafPgno);
    pLvl->iOff += fts5GetVarint(&pData->p[pLvl->iOff], (u64*)&pLvl->iRowid);
    pLvl->iFirstOff = pLvl->iOff;
  }else{
    int iOff;
    for(iOff=pLvl->iOff; iOff<pData->nn; iOff++){
      if( pData->p[iOff] ) break;
    }

    if( iOff<pData->nn ){
      u64 iVal;
      pLvl->iLeafPgno += (iOff - pLvl->iOff) + 1;
      iOff += fts5GetVarint(&pData->p[iOff], &iVal);
      pLvl->iRowid += iVal;
      pLvl->iOff = iOff;
    }else{
      pLvl->bEof = 1;
    }
  }

  return pLvl->bEof;
}